

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::ListShaders<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>>
               (Stage *stage,
               PathShaderMap<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>_> *m)

{
  bool bVar1;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *this;
  allocator local_59;
  string local_58;
  reference local_38;
  Prim *root_prim;
  const_iterator __end2;
  const_iterator __begin2;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *__range2;
  PathShaderMap<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>_> *m_local;
  Stage *stage_local;
  
  this = Stage::root_prims(stage);
  __end2._M_current =
       (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::begin
                         ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)this);
  root_prim = (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::end
                                ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                                *)&root_prim);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
               ::operator*(&__end2);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_58,"",&local_59);
    (anonymous_namespace)::TraverseShaderRec<tinyusdz::UsdPrimvarReader<tinyusdz::value::matrix4d>>
              (&local_58,local_38,0,m);
    ::std::__cxx11::string::~string((string *)&local_58);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_59);
    __gnu_cxx::
    __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
    ::operator++(&__end2);
  }
  return true;
}

Assistant:

bool ListShaders(const tinyusdz::Stage &stage,
                 PathShaderMap<T> &m /* output */) {
  // Concrete Shader type(e.g. UsdPreviewSurface) is classified as Imaging
  // Should report error at compilation stege.
  static_assert((value::TypeId::TYPE_ID_IMAGING_BEGIN <=
                 value::TypeTraits<T>::type_id()) &&
                    (value::TypeId::TYPE_ID_IMAGING_END >
                     value::TypeTraits<T>::type_id()),
                "Not a Shader type.");

  // Check at runtime. Just in case...
  if ((value::TypeId::TYPE_ID_IMAGING_BEGIN <=
       value::TypeTraits<T>::type_id()) &&
      (value::TypeId::TYPE_ID_IMAGING_END > value::TypeTraits<T>::type_id())) {
    // Ok
  } else {
    return false;
  }

  for (const auto &root_prim : stage.root_prims()) {
    TraverseShaderRec(/* root path is empty */ "", root_prim, /* depth */ 0, m);
  }

  return true;
}